

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O2

void __thiscall
Assimp::MakeVerboseFormatProcess::Execute(MakeVerboseFormatProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  byte bVar3;
  uint a;
  ulong uVar4;
  
  if (pScene != (aiScene *)0x0) {
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"MakeVerboseFormatProcess begin");
    bVar3 = 0;
    for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
      bVar1 = MakeVerboseFormat((MakeVerboseFormatProcess *)pLVar2,pScene->mMeshes[uVar4]);
      bVar3 = bVar3 | bVar1;
    }
    pLVar2 = DefaultLogger::get();
    if (bVar3 == 0) {
      Logger::debug(pLVar2,"MakeVerboseFormatProcess. There was nothing to do.");
    }
    else {
      Logger::info(pLVar2,"MakeVerboseFormatProcess finished. There was much work to do ...");
    }
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags & 0xf7;
    return;
  }
  __assert_fail("__null != pScene",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                ,0x43,"virtual void Assimp::MakeVerboseFormatProcess::Execute(aiScene *)");
}

Assistant:

void MakeVerboseFormatProcess::Execute( aiScene* pScene)
{
    ai_assert(NULL != pScene);
    ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if( MakeVerboseFormat( pScene->mMeshes[a]))
            bHas = true;
    }
    if (bHas) {
        ASSIMP_LOG_INFO("MakeVerboseFormatProcess finished. There was much work to do ...");
    } else {
        ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess. There was nothing to do.");
    }

    pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}